

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

ImDrawIdx * ImVector_ImDrawIdx_insert(ImVector_ImDrawIdx *self,ImDrawIdx *it,ImDrawIdx v)

{
  int iVar1;
  int iVar2;
  ImDrawIdx *__dest;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  __dest = self->Data;
  if (__dest <= it) {
    iVar1 = self->Size;
    lVar3 = (long)iVar1;
    if (it <= __dest + lVar3) {
      lVar5 = (long)it - (long)__dest;
      if (iVar1 == self->Capacity) {
        if (iVar1 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar1 / 2 + iVar1;
        }
        iVar6 = iVar1 + 1;
        if (iVar1 + 1 < iVar2) {
          iVar6 = iVar2;
        }
        __dest = (ImDrawIdx *)ImGui::MemAlloc((long)iVar6 * 2);
        if (self->Data != (unsigned_short *)0x0) {
          memcpy(__dest,self->Data,(long)self->Size * 2);
          ImGui::MemFree(self->Data);
        }
        self->Data = __dest;
        self->Capacity = iVar6;
        lVar3 = (long)self->Size;
      }
      lVar4 = lVar3 - (lVar5 >> 1);
      if (lVar4 != 0 && lVar5 >> 1 <= lVar3) {
        memmove((void *)((long)__dest + lVar5 + 2),(void *)((long)__dest + lVar5),lVar4 * 2);
        __dest = self->Data;
      }
      *(ImDrawIdx *)((long)__dest + lVar5) = v;
      self->Size = self->Size + 1;
      return (ImDrawIdx *)(lVar5 + (long)self->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f2,
                "T *ImVector<unsigned short>::insert(const T *, const T &) [T = unsigned short]");
}

Assistant:

CIMGUI_API ImDrawIdx* ImVector_ImDrawIdx_insert(ImVector_ImDrawIdx* self,ImDrawIdx const * it,const ImDrawIdx v)
{
    return self->insert(it,v);
}